

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcolumn_dfs.c
# Opt level: O0

int dcolumn_dfs(int m,int jcol,int *perm_r,int *nseg,int *lsub_col,int *segrep,int *repfnz,
               int_t *xprune,int *marker,int *parent,int_t *xplore,GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int_t iVar3;
  int iVar4;
  int maxsuper;
  int_t mem_error;
  int_t nzlmax;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int local_a0;
  int_t istop;
  int_t ifrom;
  int_t ito;
  int_t jm1ptr;
  int_t jptr;
  int oldrep;
  int kpar;
  int_t k;
  int_t nextl;
  int_t maxdfs;
  int_t xdfs;
  int kchild;
  int chrep;
  int chmark;
  int chperm;
  int myfnz;
  int fsupc;
  int *marker2;
  int kperm;
  int kmark;
  int krow;
  int krep;
  int nsuper;
  int jsuper;
  int jcolm1;
  int jcolp1;
  int *segrep_local;
  int *lsub_col_local;
  int *nseg_local;
  int *perm_r_local;
  int local_10;
  int jcol_local;
  int m_local;
  
  supno = Glu->xsup;
  lsub = Glu->supno;
  xlsub = Glu->lsub;
  _mem_error = Glu->xlsub;
  maxsuper = Glu->nzlmax;
  _jcolm1 = segrep;
  segrep_local = lsub_col;
  lsub_col_local = nseg;
  nseg_local = perm_r;
  perm_r_local._4_4_ = jcol;
  local_10 = m;
  iVar2 = sp_ienv(3);
  jsuper = perm_r_local._4_4_ + 1;
  nsuper = perm_r_local._4_4_ + -1;
  krow = lsub[perm_r_local._4_4_];
  kpar = _mem_error[perm_r_local._4_4_];
  _myfnz = marker + (local_10 << 1);
  oldrep = 0;
  krep = krow;
  do {
    if (segrep_local[oldrep] == -1) {
      if (perm_r_local._4_4_ == 0) {
        *lsub = 0;
        krow = 0;
      }
      else {
        iVar4 = supno[krow];
        iVar1 = _mem_error[perm_r_local._4_4_];
        local_a0 = _mem_error[nsuper];
        if (kpar - iVar1 != (iVar1 - local_a0) + -1) {
          krep = -1;
        }
        if (iVar2 <= perm_r_local._4_4_ - iVar4) {
          krep = -1;
        }
        if (krep == -1) {
          if (iVar4 < nsuper + -1) {
            istop = _mem_error[iVar4 + 1];
            _mem_error[nsuper] = istop;
            iVar2 = (istop + iVar1) - local_a0;
            xprune[nsuper] = iVar2;
            _mem_error[perm_r_local._4_4_] = iVar2;
            for (; local_a0 < kpar; local_a0 = local_a0 + 1) {
              xlsub[istop] = xlsub[local_a0];
              istop = istop + 1;
            }
            kpar = istop;
          }
          krow = krow + 1;
          lsub[perm_r_local._4_4_] = krow;
        }
      }
      supno[krow + 1] = jsuper;
      lsub[jsuper] = krow;
      xprune[perm_r_local._4_4_] = kpar;
      _mem_error[jsuper] = kpar;
      return 0;
    }
    kperm = segrep_local[oldrep];
    segrep_local[oldrep] = -1;
    marker2._4_4_ = _myfnz[kperm];
    if (marker2._4_4_ != perm_r_local._4_4_) {
      _myfnz[kperm] = perm_r_local._4_4_;
      marker2._0_4_ = nseg_local[kperm];
      if ((int)marker2 == -1) {
        iVar4 = kpar + 1;
        xlsub[kpar] = kperm;
        kpar = iVar4;
        if (maxsuper <= iVar4) {
          iVar3 = dLUMemXpand(perm_r_local._4_4_,iVar4,LSUB,&maxsuper,Glu);
          if (iVar3 != 0) {
            return iVar3;
          }
          xlsub = Glu->lsub;
        }
        if (marker2._4_4_ != nsuper) {
          krep = -1;
        }
      }
      else {
        kmark = supno[lsub[(int)marker2] + 1] + -1;
        chmark = repfnz[kmark];
        if (chmark == -1) {
          jm1ptr = -1;
          parent[kmark] = -1;
          repfnz[kmark] = (int)marker2;
          nextl = _mem_error[kmark];
          k = xprune[kmark];
          do {
            while (nextl < k) {
              maxdfs = xlsub[nextl];
              nextl = nextl + 1;
              kchild = _myfnz[maxdfs];
              if (kchild != perm_r_local._4_4_) {
                _myfnz[maxdfs] = perm_r_local._4_4_;
                chrep = nseg_local[maxdfs];
                if (chrep == -1) {
                  iVar4 = kpar + 1;
                  xlsub[kpar] = maxdfs;
                  kpar = iVar4;
                  if (maxsuper <= iVar4) {
                    iVar3 = dLUMemXpand(perm_r_local._4_4_,iVar4,LSUB,&maxsuper,Glu);
                    if (iVar3 != 0) {
                      return iVar3;
                    }
                    xlsub = Glu->lsub;
                  }
                  if (kchild != nsuper) {
                    krep = -1;
                  }
                }
                else {
                  xdfs = supno[lsub[chrep] + 1] + -1;
                  chmark = repfnz[xdfs];
                  if (chmark == -1) {
                    xplore[kmark] = nextl;
                    jm1ptr = kmark;
                    parent[xdfs] = kmark;
                    repfnz[xdfs] = chrep;
                    nextl = _mem_error[xdfs];
                    k = xprune[xdfs];
                    kmark = xdfs;
                  }
                  else if (chrep < chmark) {
                    repfnz[xdfs] = chrep;
                  }
                }
              }
            }
            _jcolm1[*lsub_col_local] = kmark;
            *lsub_col_local = *lsub_col_local + 1;
            jptr = parent[kmark];
            if (jptr == -1) break;
            nextl = xplore[jptr];
            k = xprune[jptr];
            kmark = jptr;
          } while (jptr != -1);
        }
        else if ((int)marker2 < chmark) {
          repfnz[kmark] = (int)marker2;
        }
      }
    }
    oldrep = oldrep + 1;
  } while( true );
}

Assistant:

int
dcolumn_dfs(
	   const int  m,         /* in - number of rows in the matrix */
	   const int  jcol,      /* in */
	   int        *perm_r,   /* in */
	   int        *nseg,     /* modified - with new segments appended */
	   int        *lsub_col, /* in - defines the RHS vector to start the dfs */
	   int        *segrep,   /* modified - with new segments appended */
	   int        *repfnz,   /* modified */
	   int_t      *xprune,   /* modified */
	   int        *marker,   /* modified */
	   int        *parent,	 /* working array */
	   int_t      *xplore,   /* working array */
	   GlobalLU_t *Glu       /* modified */
	   )
{

    int     jcolp1, jcolm1, jsuper, nsuper;
    int     krep, krow, kmark, kperm;
    int     *marker2;           /* Used for small panel LU */
    int	    fsupc;		/* First column of a snode */
    int     myfnz;		/* First nonz column of a U-segment */
    int	    chperm, chmark, chrep, kchild;
    int_t   xdfs, maxdfs, nextl, k;
    int     kpar, oldrep;
    int_t   jptr, jm1ptr;
    int_t   ito, ifrom, istop;	/* Used to compress row subscripts */
    int     *xsup, *supno;
    int_t   *lsub, *xlsub;
    int_t   nzlmax, mem_error;
    int     maxsuper;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    nzlmax  = Glu->nzlmax;

    maxsuper = sp_ienv(3);
    jcolp1  = jcol + 1;
    jcolm1  = jcol - 1;
    nsuper  = supno[jcol];
    jsuper  = nsuper;
    nextl   = xlsub[jcol];
    marker2 = &marker[2*m];

    /* For each nonzero in A[*,jcol] do dfs */
    for (k = 0; lsub_col[k] != SLU_EMPTY; k++) {

	krow = lsub_col[k];
    	lsub_col[k] = SLU_EMPTY;
	kmark = marker2[krow];    	

	/* krow was visited before, go to the next nonz */
        if ( kmark == jcol ) continue; 

	/* For each unmarked nbr krow of jcol
	 *	krow is in L: place it in structure of L[*,jcol]
	 */
	marker2[krow] = jcol;
	kperm = perm_r[krow];

   	if ( kperm == SLU_EMPTY ) {
	    lsub[nextl++] = krow; 	/* krow is indexed into A */
	    if ( nextl >= nzlmax ) {
		mem_error = dLUMemXpand(jcol, nextl, LSUB, &nzlmax, Glu);
		if ( mem_error ) return (mem_error);
		lsub = Glu->lsub;
	    }
            if ( kmark != jcolm1 ) jsuper = SLU_EMPTY;/* Row index subset testing */
  	} else {
	    /*	krow is in U: if its supernode-rep krep
	     *	has been explored, update repfnz[*]
	     */
	    krep = xsup[supno[kperm]+1] - 1;
	    myfnz = repfnz[krep];

	    if ( myfnz != SLU_EMPTY ) {	/* Visited before */
	    	if ( myfnz > kperm ) repfnz[krep] = kperm;
		/* continue; */
	    }
	    else {
		/* Otherwise, perform dfs starting at krep */
		oldrep = SLU_EMPTY;
	 	parent[krep] = oldrep;
	  	repfnz[krep] = kperm;
		xdfs = xlsub[krep];
	  	maxdfs = xprune[krep];

		do {
		    /* 
		     * For each unmarked kchild of krep 
		     */
		    while ( xdfs < maxdfs ) {

		   	kchild = lsub[xdfs];
			xdfs++;
		  	chmark = marker2[kchild];

		   	if ( chmark != jcol ) { /* Not reached yet */
		   	    marker2[kchild] = jcol;
		   	    chperm = perm_r[kchild];

		   	    /* Case kchild is in L: place it in L[*,k] */
		   	    if ( chperm == SLU_EMPTY ) {
			    	lsub[nextl++] = kchild;
				if ( nextl >= nzlmax ) {
				    mem_error =
					 dLUMemXpand(jcol,nextl,LSUB,&nzlmax,Glu);
				    if ( mem_error ) return (mem_error);
				    lsub = Glu->lsub;
				}
				if ( chmark != jcolm1 ) jsuper = SLU_EMPTY;
			    } else {
		    	    	/* Case kchild is in U: 
				 *   chrep = its supernode-rep. If its rep has 
			         *   been explored, update its repfnz[*]
			         */
		   	    	chrep = xsup[supno[chperm]+1] - 1;
		   		myfnz = repfnz[chrep];
		   		if ( myfnz != SLU_EMPTY ) { /* Visited before */
				    if ( myfnz > chperm )
     				  	repfnz[chrep] = chperm;
				} else {
		        	    /* Continue dfs at super-rep of kchild */
		   		    xplore[krep] = xdfs;	
		   		    oldrep = krep;
		   		    krep = chrep; /* Go deeper down G(L^t) */
				    parent[krep] = oldrep;
		    		    repfnz[krep] = chperm;
		   		    xdfs = xlsub[krep];     
				    maxdfs = xprune[krep];
				} /* else */

			   } /* else */

			} /* if */

		    } /* while */

		    /* krow has no more unexplored nbrs;
	   	     *    place supernode-rep krep in postorder DFS.
	   	     *    backtrack dfs to its parent
		     */
		    segrep[*nseg] = krep;
		    ++(*nseg);
		    kpar = parent[krep]; /* Pop from stack, mimic recursion */
		    if ( kpar == SLU_EMPTY ) break; /* dfs done */
		    krep = kpar;
		    xdfs = xplore[krep];
		    maxdfs = xprune[krep];

		} while ( kpar != SLU_EMPTY ); 	/* Until empty stack */

	    } /* else */

	} /* else */

    } /* for each nonzero ... */

    /* Check to see if j belongs in the same supernode as j-1 */
    if ( jcol == 0 ) { /* Do nothing for column 0 */
	nsuper = supno[0] = 0;
    } else {
   	fsupc = xsup[nsuper];
	jptr = xlsub[jcol];	/* Not compressed yet */
	jm1ptr = xlsub[jcolm1];

#ifdef T2_SUPER
	if ( (nextl-jptr != jptr-jm1ptr-1) ) jsuper = SLU_EMPTY;
#endif
	/* Make sure the number of columns in a supernode doesn't
	   exceed threshold. */
	if ( jcol - fsupc >= maxsuper ) jsuper = SLU_EMPTY;

	/* If jcol starts a new supernode, reclaim storage space in
	 * lsub from the previous supernode. Note we only store
	 * the subscript set of the first and last columns of
   	 * a supernode. (first for num values, last for pruning)
	 */
	if ( jsuper == SLU_EMPTY ) {	/* starts a new supernode */
	    if ( (fsupc < jcolm1-1) ) {	/* >= 3 columns in nsuper */
#ifdef CHK_COMPRESS
		printf("  Compress lsub[] at super %d-%d\n", fsupc, jcolm1);
#endif
	        ito = xlsub[fsupc+1];
		xlsub[jcolm1] = ito;
		istop = ito + jptr - jm1ptr;
		xprune[jcolm1] = istop; /* Initialize xprune[jcol-1] */
		xlsub[jcol] = istop;
		for (ifrom = jm1ptr; ifrom < nextl; ++ifrom, ++ito)
		    lsub[ito] = lsub[ifrom];
		nextl = ito;            /* = istop + length(jcol) */
	    }
	    nsuper++;
	    supno[jcol] = nsuper;
	} /* if a new supernode */

    }	/* else: jcol > 0 */ 
    
    /* Tidy up the pointers before exit */
    xsup[nsuper+1] = jcolp1;
    supno[jcolp1]  = nsuper;
    xprune[jcol]   = nextl;	/* Initialize upper bound for pruning */
    xlsub[jcolp1]  = nextl;

    return 0;
}